

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalcontainer.cpp
# Opt level: O0

void __thiscall
hbm::streaming::SignalContainer::processMetaInformation
          (SignalContainer *this,uint signalNumber,string *method,Value *params)

{
  bool bVar1;
  function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false,_false>,_bool>
  pVar2;
  SubscribedSignal *signal;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false,_false>,_bool>
  result;
  iterator iter;
  Value *in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  _Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
  in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb18;
  uint signalNumber_00;
  SubscribedSignal *in_stack_fffffffffffffb20;
  Value local_4c0 [7];
  Value *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  SubscribedSignal *in_stack_fffffffffffffc80;
  _Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
  local_28 [5];
  
  signalNumber_00 = (uint)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_28[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
       ::find((unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
               *)in_stack_fffffffffffffaf8,(key_type *)0x144570);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                          (char *)in_stack_fffffffffffffaf8);
  if (bVar1) {
    std::
    unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
    ::erase((unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
             *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
            (key_type *)in_stack_fffffffffffffaf8);
  }
  else {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
         ::end((unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
                *)in_stack_fffffffffffffaf8);
    bVar1 = std::__detail::operator==(local_28,&local_30);
    if (bVar1) {
      in_stack_fffffffffffffaf8 = local_4c0;
      SubscribedSignal::SubscribedSignal(in_stack_fffffffffffffb20,signalNumber_00);
      pVar2 = std::
              unordered_map<unsigned_int,hbm::streaming::SubscribedSignal,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,hbm::streaming::SubscribedSignal>>>
              ::emplace<unsigned_int&,hbm::streaming::SubscribedSignal>
                        ((unordered_map<unsigned_int,_hbm::streaming::SubscribedSignal,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>_>
                          *)in_RDI,(uint *)in_stack_fffffffffffffb08._M_cur,
                         (SubscribedSignal *)
                         CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
      in_stack_fffffffffffffb07 = pVar2.second;
      in_stack_fffffffffffffb08 =
           pVar2.first.
           super__Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
      ;
      SubscribedSignal::~SubscribedSignal((SubscribedSignal *)0x144643);
      local_28[0] = pVar2.first.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
      ;
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false,_false>
                *)0x14467c);
    SubscribedSignal::processSignalMetaInformation
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
                        *)0x1446ad);
    if (bVar1) {
      std::
      function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
      ::operator()(in_RDI,(SubscribedSignal *)in_stack_fffffffffffffb08._M_cur,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                   in_stack_fffffffffffffaf8);
    }
  }
  return;
}

Assistant:

void SignalContainer::processMetaInformation(unsigned int signalNumber, const std::string& method, const Json::Value& params)
		{
			signals_t::iterator iter = m_subscribedsignals.find(signalNumber);

			if(method=="unsubscribe") {
				m_subscribedsignals.erase(signalNumber);
				return;
			}

			if (iter == m_subscribedsignals.end()) {
#ifdef _MSC_VER
				std::pair < signals_t::iterator, bool > result = m_subscribedsignals.insert(std::make_pair(signalNumber, SubscribedSignal(signalNumber)));
#else
				std::pair < signals_t::iterator, bool > result = m_subscribedsignals.emplace(signalNumber, SubscribedSignal(signalNumber));
#endif
				iter = result.first;
			}

			SubscribedSignal& signal = iter->second;
			signal.processSignalMetaInformation(method, params);
			if (m_signalMetaCb) {
				m_signalMetaCb(signal, method, params);
			}
		}